

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::mapLocalsAndEmitHeader(BinaryInstWriter *this)

{
  __node_base_ptr *pp_Var1;
  uint uVar2;
  mapped_type mVar3;
  pointer pTVar4;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __seed;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __last;
  BufferWithRandomAccess *this_00;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar6;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar7;
  Index IVar8;
  uint uVar9;
  size_t sVar10;
  mapped_type *pmVar11;
  pointer pTVar12;
  Type *pTVar13;
  uint *puVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  __node_base_ptr *pp_Var17;
  Function *pFVar18;
  int iVar19;
  ulong uVar20;
  _Hash_node_base *p_Var21;
  Type *localType;
  Type *type_1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar22;
  undefined1 local_f0 [8];
  InsertOrderedMap<wasm::Type,_unsigned_int> scratches;
  key_type local_98;
  undefined1 local_90 [8];
  unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  nextFreeIndex;
  Type type;
  Index local_38;
  
  pFVar18 = this->func;
  if (pFVar18 != (Function *)0x0) {
    uVar20 = 0;
    while( true ) {
      sVar10 = Function::getNumParams(pFVar18);
      if (sVar10 <= uVar20) break;
      local_f0._4_4_ = 0;
      local_f0._0_4_ = (uint)uVar20;
      pmVar11 = std::__detail::
                _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this,(key_type *)local_f0);
      *pmVar11 = uVar20;
      uVar20 = (ulong)((uint)uVar20 + 1);
      pFVar18 = this->func;
    }
    countScratchLocals((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_f0,this);
    pFVar18 = this->func;
    if (this->DWARF == false) {
      pTVar4 = (pFVar18->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pTVar12 = (pFVar18->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                     _M_impl.super__Vector_impl_data._M_start; pTVar12 != pTVar4;
          pTVar12 = pTVar12 + 1) {
        nextFreeIndex._M_h._M_single_bucket = (__node_base_ptr)pTVar12->id;
        local_90 = (undefined1  [8])&nextFreeIndex._M_h._M_single_bucket;
        nextFreeIndex._M_h._M_buckets = (__buckets_ptr)0x0;
        PVar22 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)local_90);
        for (; PVar5.index = (size_t)nextFreeIndex._M_h._M_buckets, PVar5.parent = (Type *)local_90,
            PVar22 != PVar5;
            nextFreeIndex._M_h._M_buckets = (__buckets_ptr)((long)nextFreeIndex._M_h._M_buckets + 1)
            ) {
          pTVar13 = wasm::Type::Iterator::operator*((Iterator *)local_90);
          noteLocalType(this,(Type)pTVar13->id,1);
        }
      }
      pp_Var1 = &scratches.Map._M_h._M_single_bucket;
      pp_Var17 = pp_Var1;
      while (pp_Var17 = &(*pp_Var17)->_M_nxt, pp_Var17 != pp_Var1) {
        noteLocalType(this,(Type)((__node_base_ptr)(pp_Var17 + 2))->_M_nxt,
                      *(Index *)&((__node_base_ptr)(pp_Var17 + 3))->_M_nxt);
      }
      if (((this->parent->wasm->features).features & 0x100) != 0) {
        __seed._M_current =
             (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
        __last._M_current =
             (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__seed._M_current != __last._M_current) {
          nextFreeIndex._M_h._M_single_bucket =
               (__node_base_ptr)
               CONCAT71(nextFreeIndex._M_h._M_single_bucket._1_7_,
                        ((__seed._M_current)->id & 1) == 0 && 6 < (__seed._M_current)->id);
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_wasm::Type>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_wasm::Type>
                               *)local_90,__seed,
                              (((long)__last._M_current - (long)__seed._M_current >> 3) + 1) / 2);
          if (nextFreeIndex._M_h._M_bucket_count == 0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::BinaryInstWriter::mapLocalsAndEmitHeader()::__0>>
                      (__seed,__last,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_stack_cpp:2821:60)>
                        )&nextFreeIndex._M_h._M_single_bucket);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,wasm::Type*,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::BinaryInstWriter::mapLocalsAndEmitHeader()::__0>>
                      (__seed,__last,(Type *)nextFreeIndex._M_h._M_bucket_count,
                       (long)nextFreeIndex._M_h._M_buckets,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_stack_cpp:2821:60)>
                        )&nextFreeIndex._M_h._M_single_bucket);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_wasm::Type>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_wasm::Type>
                      *)local_90);
        }
      }
      local_90 = (undefined1  [8])&nextFreeIndex._M_h._M_rehash_policy._M_next_resize;
      nextFreeIndex._M_h._M_buckets = (__buckets_ptr)0x1;
      nextFreeIndex._M_h._M_bucket_count = 0;
      nextFreeIndex._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      nextFreeIndex._M_h._M_element_count._0_4_ = 0x3f800000;
      nextFreeIndex._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      nextFreeIndex._M_h._M_rehash_policy._4_4_ = 0;
      nextFreeIndex._M_h._M_rehash_policy._M_next_resize = 0;
      IVar8 = Function::getVarIndexBase(this->func);
      pTVar4 = (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar12 = (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                     _M_impl.super__Vector_impl_data._M_start; pTVar12 != pTVar4;
          pTVar12 = pTVar12 + 1) {
        pmVar15 = std::__detail::
                  _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_90,pTVar12);
        *pmVar15 = IVar8;
        pmVar16 = std::__detail::
                  _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->numLocalsByType,pTVar12);
        IVar8 = IVar8 + (int)*pmVar16;
      }
      for (IVar8 = Function::getVarIndexBase(this->func);
          sVar10 = Function::getNumLocals(this->func), IVar8 < sVar10; IVar8 = IVar8 + 1) {
        scratches.List.
        super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
        ._M_impl._M_node._M_size = (size_t)Function::getLocalType(this->func,IVar8);
        nextFreeIndex._M_h._M_single_bucket =
             (__node_base_ptr)
             &scratches.List.
              super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
              ._M_impl._M_node._M_size;
        type.id = 0;
        PVar22 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)nextFreeIndex._M_h._M_single_bucket);
        uVar9 = 0;
        for (; PVar7.index = type.id, PVar7.parent = (Type *)nextFreeIndex._M_h._M_single_bucket,
            PVar22 != PVar7; type.id = type.id + 1) {
          pTVar13 = wasm::Type::Iterator::operator*
                              ((Iterator *)&nextFreeIndex._M_h._M_single_bucket);
          pmVar15 = std::__detail::
                    _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_90,pTVar13);
          uVar2 = *pmVar15;
          *pmVar15 = uVar2 + 1;
          local_98.first = IVar8;
          local_98.second = uVar9;
          pmVar11 = std::__detail::
                    _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this,&local_98);
          uVar9 = uVar9 + 1;
          *pmVar11 = (ulong)uVar2;
        }
      }
      for (p_Var21 = scratches.Map._M_h._M_single_bucket;
          p_Var21 != (_Hash_node_base *)&scratches.Map._M_h._M_single_bucket;
          p_Var21 = p_Var21->_M_nxt) {
        pmVar15 = std::__detail::
                  _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_90,(key_type *)(p_Var21 + 2));
        mVar3 = *pmVar15;
        puVar14 = InsertOrderedMap<wasm::Type,_unsigned_int>::operator[]
                            (&this->scratchLocals,(Type *)(p_Var21 + 2));
        *puVar14 = mVar3;
      }
      BufferWithRandomAccess::operator<<
                (this->o,(U32LEB)(uint)(this->numLocalsByType)._M_h._M_element_count);
      pTVar4 = (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar12 = (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                     _M_impl.super__Vector_impl_data._M_start; pTVar12 != pTVar4;
          pTVar12 = pTVar12 + 1) {
        this_00 = this->o;
        pmVar16 = std::__detail::
                  _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::at((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&this->numLocalsByType,pTVar12);
        BufferWithRandomAccess::operator<<(this_00,(U32LEB)(uint)*pmVar16);
        WasmBinaryWriter::writeType(this->parent,(Type)pTVar12->id);
      }
      std::
      _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_90);
    }
    else {
      local_38 = Function::getVarIndexBase(pFVar18);
      IVar8 = Function::getVarIndexBase(this->func);
      while( true ) {
        sVar10 = Function::getNumLocals(this->func);
        if (sVar10 <= IVar8) break;
        local_90 = (undefined1  [8])Function::getLocalType(this->func,IVar8);
        sVar10 = wasm::Type::size((Type *)local_90);
        uVar20 = 0;
        while (iVar19 = (int)uVar20, uVar20 < sVar10) {
          local_90 = (undefined1  [8])(uVar20 << 0x20 | (ulong)IVar8);
          pmVar11 = std::__detail::
                    _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this,(key_type *)local_90);
          *pmVar11 = (ulong)(iVar19 + local_38);
          uVar20 = (ulong)(iVar19 + 1);
        }
        IVar8 = IVar8 + 1;
        local_38 = local_38 + iVar19;
      }
      IVar8 = Function::getVarIndexBase(this->func);
      BufferWithRandomAccess::operator<<
                (this->o,(U32LEB)((local_38 - IVar8) +
                                 (int)scratches.Map._M_h._M_before_begin._M_nxt));
      for (uVar9 = Function::getVarIndexBase(this->func);
          sVar10 = Function::getNumLocals(this->func), uVar9 < sVar10; uVar9 = uVar9 + 1) {
        nextFreeIndex._M_h._M_single_bucket =
             (__node_base_ptr)Function::getLocalType(this->func,uVar9);
        local_90 = (undefined1  [8])&nextFreeIndex._M_h._M_single_bucket;
        nextFreeIndex._M_h._M_buckets = (__buckets_ptr)0x0;
        PVar22 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end((Type *)local_90);
        for (; PVar6.index = (size_t)nextFreeIndex._M_h._M_buckets, PVar6.parent = (Type *)local_90,
            PVar22 != PVar6;
            nextFreeIndex._M_h._M_buckets = (__buckets_ptr)((long)nextFreeIndex._M_h._M_buckets + 1)
            ) {
          pTVar13 = wasm::Type::Iterator::operator*((Iterator *)local_90);
          BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x1);
          WasmBinaryWriter::writeType(this->parent,(Type)pTVar13->id);
        }
      }
      for (p_Var21 = scratches.Map._M_h._M_single_bucket;
          p_Var21 != (_Hash_node_base *)&scratches.Map._M_h._M_single_bucket;
          p_Var21 = p_Var21->_M_nxt) {
        BufferWithRandomAccess::operator<<(this->o,(U32LEB)*(uint *)&p_Var21[3]._M_nxt);
        WasmBinaryWriter::writeType(this->parent,(Type)p_Var21[2]._M_nxt);
        puVar14 = InsertOrderedMap<wasm::Type,_unsigned_int>::operator[]
                            (&this->scratchLocals,(Type *)(p_Var21 + 2));
        *puVar14 = local_38;
        local_38 = local_38 + *(int *)&p_Var21[3]._M_nxt;
      }
    }
    InsertOrderedMap<wasm::Type,_unsigned_int>::~InsertOrderedMap
              ((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_f0);
    return;
  }
  __assert_fail("func && \"BinaryInstWriter: function is not set\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                ,0xabf,"void wasm::BinaryInstWriter::mapLocalsAndEmitHeader()");
}

Assistant:

void BinaryInstWriter::mapLocalsAndEmitHeader() {
  assert(func && "BinaryInstWriter: function is not set");
  // Map params
  for (Index i = 0; i < func->getNumParams(); i++) {
    mappedLocals[std::make_pair(i, 0)] = i;
  }

  auto scratches = countScratchLocals();

  // Normally we map all locals of the same type into a range of adjacent
  // addresses, which is more compact. However, if we need to keep DWARF valid,
  // do not do any reordering at all - instead, do a trivial mapping that
  // keeps everything unmoved.
  //
  // Unless we have run DWARF-invalidating passes, all locals added during the
  // process that are not in DWARF info (tuple locals, tuple scratch locals,
  // locals to resolve stacky format, ..) have been all tacked on to the
  // existing locals and happen at the end, so as long as we print the local
  // types in order, we don't invalidate original local DWARF info here.
  if (DWARF) {
    Index mappedIndex = func->getVarIndexBase();
    for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
      size_t size = func->getLocalType(i).size();
      for (Index j = 0; j < size; j++) {
        mappedLocals[std::make_pair(i, j)] = mappedIndex++;
      }
    }

    size_t numBinaryLocals =
      mappedIndex - func->getVarIndexBase() + scratches.size();

    o << U32LEB(numBinaryLocals);

    for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
      for (const auto& type : func->getLocalType(i)) {
        o << U32LEB(1);
        parent.writeType(type);
      }
    }
    for (auto& [type, count] : scratches) {
      o << U32LEB(count);
      parent.writeType(type);
      scratchLocals[type] = mappedIndex;
      mappedIndex += count;
    }
    return;
  }

  for (auto type : func->vars) {
    for (const auto& t : type) {
      noteLocalType(t);
    }
  }

  for (auto& [type, count] : scratches) {
    noteLocalType(type, count);
  }

  if (parent.getModule()->features.hasReferenceTypes()) {
    // Sort local types in a way that keeps all MVP types together and all
    // reference types together. E.g. it is helpful to avoid a block of i32s in
    // between blocks of different reference types, since clearing out reference
    // types may require different work.
    //
    // See https://github.com/WebAssembly/binaryen/issues/4773
    //
    // In order to decide whether to put MVP types or reference types first,
    // look at the type of the first local. In an optimized binary we will have
    // sorted the locals by frequency of uses, so this way we'll keep the most
    // commonly-used local at the top, which should work well in many cases.
    bool refsFirst = !localTypes.empty() && localTypes[0].isRef();
    std::stable_sort(localTypes.begin(), localTypes.end(), [&](Type a, Type b) {
      if (refsFirst) {
        return a.isRef() && !b.isRef();
      } else {
        return !a.isRef() && b.isRef();
      }
    });
  }

  // Map IR (local index, tuple index) pairs to binary local indices. Since
  // locals are grouped by type, start by calculating the base indices for each
  // type.
  std::unordered_map<Type, Index> nextFreeIndex;
  Index baseIndex = func->getVarIndexBase();
  for (auto& type : localTypes) {
    nextFreeIndex[type] = baseIndex;
    baseIndex += numLocalsByType[type];
  }

  // Map the IR index pairs to indices.
  for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
    Index j = 0;
    for (const auto& type : func->getLocalType(i)) {
      mappedLocals[{i, j++}] = nextFreeIndex[type]++;
    }
  }

  // Map scratch locals to the remaining indices.
  for (auto& [type, _] : scratches) {
    scratchLocals[type] = nextFreeIndex[type];
  }

  o << U32LEB(numLocalsByType.size());
  for (auto& localType : localTypes) {
    o << U32LEB(numLocalsByType.at(localType));
    parent.writeType(localType);
  }
}